

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

int run_test_fs_readdir_non_empty_dir(void)

{
  char *__s1;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *req;
  long lVar3;
  uv_fs_t close_req;
  uv_fs_t create_req;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t uStack_8d8;
  uv_loop_t *puStack_720;
  uv_fs_t local_710;
  undefined1 local_558 [880];
  uv_fs_t local_1e8;
  
  puStack_720 = (uv_loop_t *)0x1582ad;
  cleanup_test_files();
  puStack_720 = (uv_loop_t *)0x1582b2;
  puVar2 = uv_default_loop();
  puStack_720 = (uv_loop_t *)0x1582d1;
  iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)(local_558 + 0x1b8),"test_dir",0x1ed,(uv_fs_cb)0x0);
  if (iVar1 == 0) {
    puStack_720 = (uv_loop_t *)0x1582de;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x158303;
    iVar1 = uv_fs_open(puVar2,(uv_fs_t *)local_558,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    req = unaff_RBX;
    if (iVar1 < 0) goto LAB_001586a9;
    req = (uv_fs_t *)local_558;
    puStack_720 = (uv_loop_t *)0x15831b;
    uv_fs_req_cleanup(req);
    puStack_720 = (uv_loop_t *)0x158320;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x158332;
    iVar1 = uv_fs_close(puVar2,&local_710,local_558._88_4_,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001586ae;
    puStack_720 = (uv_loop_t *)0x158344;
    uv_fs_req_cleanup(&local_710);
    puStack_720 = (uv_loop_t *)0x158349;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x15836e;
    iVar1 = uv_fs_open(puVar2,(uv_fs_t *)local_558,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_001586b3;
    req = (uv_fs_t *)local_558;
    puStack_720 = (uv_loop_t *)0x158386;
    uv_fs_req_cleanup(req);
    puStack_720 = (uv_loop_t *)0x15838b;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x15839d;
    iVar1 = uv_fs_close(puVar2,&local_710,local_558._88_4_,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001586b8;
    puStack_720 = (uv_loop_t *)0x1583af;
    uv_fs_req_cleanup(&local_710);
    puStack_720 = (uv_loop_t *)0x1583b4;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x1583d3;
    iVar1 = uv_fs_mkdir(puVar2,(uv_fs_t *)(local_558 + 0x1b8),"test_dir/test_subdir",0x1ed,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001586bd;
    puStack_720 = (uv_loop_t *)0x1583e8;
    uv_fs_req_cleanup((uv_fs_t *)(local_558 + 0x1b8));
    req = &opendir_req;
    puStack_720 = (uv_loop_t *)0x158401;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_720 = (uv_loop_t *)0x158406;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x15841a;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_001586c2;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_001586c7;
    if (opendir_req.result != 0) goto LAB_001586cc;
    if (opendir_req.ptr == (void *)0x0) goto LAB_001586d1;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_720 = (uv_loop_t *)0x15846b;
    uv_fs_req_cleanup(&opendir_req);
    puStack_720 = (uv_loop_t *)0x158470;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x158484;
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)unaff_RBX,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
LAB_0015869f:
      puStack_720 = (uv_loop_t *)0x1586a4;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_001586a4;
    }
    lVar3 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_720 = (uv_loop_t *)0x1584b9;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_720 = (uv_loop_t *)0x1584cc;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_001584e3;
        puStack_720 = (uv_loop_t *)0x1584db;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_001584e3;
LAB_00158695:
        puStack_720 = (uv_loop_t *)0x15869a;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015869a:
        puStack_720 = (uv_loop_t *)0x15869f;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015869f;
      }
LAB_001584e3:
      puStack_720 = (uv_loop_t *)0x1584ee;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015850b;
        goto LAB_0015869a;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_720 = (uv_loop_t *)0x158695;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_00158695;
      }
LAB_0015850b:
      puStack_720 = (uv_loop_t *)0x158513;
      uv_fs_req_cleanup(&readdir_req);
      puStack_720 = (uv_loop_t *)0x158518;
      puVar2 = uv_default_loop();
      puStack_720 = (uv_loop_t *)0x158528;
      iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)unaff_RBX,(uv_fs_cb)0x0);
      lVar3 = lVar3 + -1;
    } while (iVar1 != 0);
    if (lVar3 != 0) goto LAB_0015869f;
    puStack_720 = (uv_loop_t *)0x158548;
    uv_fs_req_cleanup(&readdir_req);
    puStack_720 = (uv_loop_t *)0x158561;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_720 = (uv_loop_t *)0x158566;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x158576;
    uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)unaff_RBX,(uv_fs_cb)0x0);
    if (closedir_req.result != 0) goto LAB_001586d6;
    puStack_720 = (uv_loop_t *)0x158590;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_720 = (uv_loop_t *)0x1585a9;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_720 = (uv_loop_t *)0x1585ae;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x1585c7;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_001586db;
    if (non_empty_opendir_cb_count != 0) goto LAB_001586e0;
    if (non_empty_closedir_cb_count != 0) goto LAB_001586e5;
    puStack_720 = (uv_loop_t *)0x1585ee;
    puVar2 = uv_default_loop();
    puStack_720 = (uv_loop_t *)0x1585f8;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001586ea;
    if (non_empty_opendir_cb_count != 1) goto LAB_001586ef;
    if (non_empty_closedir_cb_count == 1) {
      puStack_720 = (uv_loop_t *)0x15861f;
      puVar2 = uv_default_loop();
      puStack_720 = (uv_loop_t *)0x15863b;
      uv_fs_rmdir(puVar2,&local_1e8,"test_subdir",(uv_fs_cb)0x0);
      puStack_720 = (uv_loop_t *)0x158643;
      uv_fs_req_cleanup(&local_1e8);
      puStack_720 = (uv_loop_t *)0x158648;
      cleanup_test_files();
      puStack_720 = (uv_loop_t *)0x15864d;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_720 = (uv_loop_t *)0x158661;
      uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_720 = (uv_loop_t *)0x15866b;
      uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
      puStack_720 = (uv_loop_t *)0x158670;
      puVar2 = uv_default_loop();
      puStack_720 = (uv_loop_t *)0x158678;
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001586f9;
    }
  }
  else {
LAB_001586a4:
    puStack_720 = (uv_loop_t *)0x1586a9;
    run_test_fs_readdir_non_empty_dir_cold_1();
    req = unaff_RBX;
LAB_001586a9:
    puStack_720 = (uv_loop_t *)0x1586ae;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_001586ae:
    puStack_720 = (uv_loop_t *)0x1586b3;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_001586b3:
    puStack_720 = (uv_loop_t *)0x1586b8;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_001586b8:
    puStack_720 = (uv_loop_t *)0x1586bd;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_001586bd:
    puStack_720 = (uv_loop_t *)0x1586c2;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_001586c2:
    puStack_720 = (uv_loop_t *)0x1586c7;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_001586c7:
    puStack_720 = (uv_loop_t *)0x1586cc;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_001586cc:
    unaff_RBX = req;
    puStack_720 = (uv_loop_t *)0x1586d1;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_001586d1:
    puStack_720 = (uv_loop_t *)0x1586d6;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_001586d6:
    puStack_720 = (uv_loop_t *)0x1586db;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_001586db:
    puStack_720 = (uv_loop_t *)0x1586e0;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_001586e0:
    puStack_720 = (uv_loop_t *)0x1586e5;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_001586e5:
    puStack_720 = (uv_loop_t *)0x1586ea;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_001586ea:
    puStack_720 = (uv_loop_t *)0x1586ef;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_001586ef:
    puStack_720 = (uv_loop_t *)0x1586f4;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_720 = (uv_loop_t *)0x1586f9;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_001586f9:
  puStack_720 = (uv_loop_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_720 = (uv_loop_t *)unaff_RBX;
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_8d8,"test_dir/file1",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8d8);
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_8d8,"test_dir/file2",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8d8);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_8d8,"test_dir/test_subdir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8d8);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_8d8,"test_dir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_8d8);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_readdir_non_empty_dir) {
  size_t entries_count;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t create_req;
  uv_fs_t close_req;
  uv_dir_t* dir;
  int r;

  cleanup_test_files();

  r = uv_fs_mkdir(uv_default_loop(), &mkdir_req, "test_dir", 0755, NULL);
  ASSERT(r == 0);

  /* Create two files synchronously. */
  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file1",
                 O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(),
                  &close_req,
                  create_req.result,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file2",
                 O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(),
                  &close_req,
                  create_req.result,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_mkdir(uv_default_loop(),
                  &mkdir_req,
                  "test_dir/test_subdir",
                  0755,
                  NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, "test_dir", NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);

  entries_count = 0;
  dir = opendir_req.ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  uv_fs_req_cleanup(&opendir_req);

  while (uv_fs_readdir(uv_default_loop(),
                       &readdir_req,
                       dir,
                       NULL) != 0) {
  ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
         strcmp(dirents[0].name, "file2") == 0 ||
         strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT(dirents[0].type == UV_DIRENT_DIR);
    else
      ASSERT(dirents[0].type == UV_DIRENT_FILE);
#else
    ASSERT(dirents[0].type == UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */
    uv_fs_req_cleanup(&readdir_req);
    ++entries_count;
  }

  ASSERT(entries_count == 3);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    "test_dir",
                    non_empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(non_empty_opendir_cb_count == 0);
  ASSERT(non_empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(non_empty_opendir_cb_count == 1);
  ASSERT(non_empty_closedir_cb_count == 1);

  uv_fs_rmdir(uv_default_loop(), &rmdir_req, "test_subdir", NULL);
  uv_fs_req_cleanup(&rmdir_req);

  cleanup_test_files();
  MAKE_VALGRIND_HAPPY();
  return 0;
 }